

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_time(archive *_a,wchar_t flag,time_t sec,long nsec)

{
  archive *in_RCX;
  time_t in_RDX;
  wchar_t in_ESI;
  archive_match *in_RDI;
  wchar_t r;
  char *in_stack_ffffffffffffffc8;
  wchar_t in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  local_4 = validate_time_flag(in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  if (local_4 == L'\0') {
    local_4 = set_timefilter(in_RDI,in_ESI,in_RDX,(long)in_RCX,in_RDX,(long)in_RCX);
  }
  return local_4;
}

Assistant:

int
archive_match_include_time(struct archive *_a, int flag, time_t sec,
    long nsec)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter((struct archive_match *)_a, flag,
			sec, nsec, sec, nsec);
}